

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.h
# Opt level: O0

void __thiscall Regex::Element::insertChild(Element *this,Element *e)

{
  Element *local_20;
  Element *c;
  Element *e_local;
  Element *this_local;
  
  e->mParent = this;
  e->mNext = (Element *)0x0;
  if (this->mChild == (Element *)0x0) {
    this->mChild = e;
  }
  else {
    for (local_20 = this->mChild; local_20->mNext != (Element *)0x0; local_20 = local_20->mNext) {
    }
    local_20->mNext = e;
  }
  return;
}

Assistant:

void insertChild( Element *e )
		{
			e->mParent = this;
			e->mNext = NULL;
			if ( mChild != NULL )
			{
				Element *c = mChild;
				while( c->mNext != NULL )
					c = c->mNext;
			
				c->mNext = e;
			}
			else
				mChild = e;
		}